

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O2

INT32 calc_sqr(NES_APU *apu,int i,UINT32 clocks)

{
  int *piVar1;
  uint uVar2;
  INT32 IVar3;
  int iVar4;
  int *piVar5;
  
  uVar2 = apu->freq[(uint)i];
  for (iVar4 = clocks + apu->scounter[(uint)i]; (int)uVar2 < iVar4; iVar4 = iVar4 + ~uVar2) {
    apu->sphase[(uint)i] = apu->sphase[(uint)i] + 1U & 0xf;
  }
  apu->scounter[(uint)i] = iVar4;
  IVar3 = 0;
  if (((7 < (int)uVar2) && (0 < apu->length_counter[(uint)i])) && (apu->sfreq[(uint)i] < 0x800)) {
    piVar1 = apu->volume + (uint)i;
    piVar5 = apu->envelope_counter + (uint)i;
    if (apu->envelope_disable[(uint)i] != false) {
      piVar5 = piVar1;
    }
    IVar3 = 0;
    if (calc_sqr::sqrtbl[piVar1[-2]][piVar1[-4]] != 0) {
      IVar3 = *piVar5;
    }
  }
  return IVar3;
}

Assistant:

static INT32 calc_sqr(NES_APU* apu, int i, UINT32 clocks)
{
	static const INT16 sqrtbl[4][16] = {
		{0, 0, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
		{0, 0, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0},
		{0, 0, 1, 1, 1, 1, 1, 1, 1, 1, 0, 0, 0, 0, 0, 0},
		{1, 1, 0, 0, 0, 0, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1}
	};
	INT32 ret = 0;

	apu->scounter[i] += clocks;
	while (apu->scounter[i] > apu->freq[i])
	{
		apu->sphase[i] = (apu->sphase[i] + 1) & 15;
		apu->scounter[i] -= (apu->freq[i] + 1);
	}

	//INT32 ret = 0;
	if (apu->length_counter[i] > 0 &&
		apu->freq[i] >= 8 &&
		apu->sfreq[i] < 0x800
		)
	{
		int v = apu->envelope_disable[i] ? apu->volume[i] : apu->envelope_counter[i];
		ret = sqrtbl[apu->duty[i]][apu->sphase[i]] ? v : 0;
	}
	
	return ret;
}